

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_sifm.cc
# Opt level: O0

bool __thiscall
hwtest::pgraph::anon_unknown_17::MthdDvdSrcFormat::is_valid_val(MthdDvdSrcFormat *this)

{
  uint uVar1;
  uint uVar2;
  int sfmt;
  MthdDvdSrcFormat *this_local;
  
  uVar1 = (this->super_SingleMthdTest).super_MthdTest.val >> 0x10;
  if (uVar1 != 0) {
    uVar2 = 2;
    if (this->which != 0) {
      uVar2 = 3;
    }
    if (uVar1 <= uVar2) {
      if ((((this->super_SingleMthdTest).super_MthdTest.val & 0xe000) != 0) &&
         (((this->super_SingleMthdTest).super_MthdTest.cls == 0x38 || (this->which == 1)))) {
        return false;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool is_valid_val() override {
		int sfmt = extr(val, 16, 16);
		if (sfmt == 0 || sfmt > (which ? 3 : 2))
			return false;
		if (val & 0xe000 && (cls == 0x38 || which == 1))
			return false;
		return true;
	}